

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cpp
# Opt level: O0

string * __thiscall
cali::util::demangle_abi_cxx11_(string *__return_storage_ptr__,util *this,char *name)

{
  int local_2c;
  char *pcStack_28;
  int status;
  char *demangled;
  util *local_18;
  char *name_local;
  string *result;
  
  demangled._7_1_ = 0;
  local_18 = this;
  name_local = (char *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  if (local_18 != (util *)0x0) {
    pcStack_28 = (char *)0x0;
    local_2c = -1;
    if ((*local_18 == (util)0x5f) && (local_18[1] == (util)0x5a)) {
      pcStack_28 = (char *)__cxa_demangle(local_18,0,0,&local_2c);
    }
    if (local_2c == 0) {
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,pcStack_28);
    }
    else {
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(char *)local_18);
    }
    free(pcStack_28);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string demangle(const char* name)
{
#ifdef _WIN32
    // not sure how to demangle on Windows, make it a no-op for now.
    return name;
#else
    std::string result;

    if (!name)
        return result;

    char* demangled = nullptr;
    int   status    = -1;

    if (name[0] == '_' && name[1] == 'Z')
        demangled = abi::__cxa_demangle(name, nullptr, 0, &status);

    if (status == 0)
        result = demangled;
    else
        result = name;

    free(demangled);

    return result;
#endif
}